

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::AddPackage
          (DescriptorBuilder *this,string *name,Message *proto,FileDescriptor *file)

{
  Type TVar1;
  Tables *this_00;
  _Node **pp_Var2;
  ulong uVar3;
  char *__s1;
  Message *proto_00;
  bool bVar4;
  int iVar5;
  long lVar6;
  string *name_00;
  ulong uVar7;
  long *plVar8;
  FileDescriptor *pFVar9;
  char cVar10;
  _Node *p_Var11;
  long *plVar12;
  size_type *psVar13;
  char *pcVar14;
  Symbol *pSVar15;
  _Node *p_Var16;
  Symbol symbol;
  string local_b8;
  Message *local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  symbol.field_1.package_file_descriptor = file;
  symbol._0_8_ = 7;
  bVar4 = DescriptorPool::Tables::AddSymbol(this->tables_,name,symbol);
  local_98 = proto;
  if (bVar4) {
    lVar6 = std::__cxx11::string::rfind((char)name,0x2e);
    if (lVar6 == -1) {
      ValidateSymbolName(this,name,name,proto);
      return;
    }
    this_00 = this->tables_;
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)name);
    name_00 = DescriptorPool::Tables::AllocateString(this_00,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    proto_00 = local_98;
    AddPackage(this,name_00,local_98,file);
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)name);
    ValidateSymbolName(this,&local_b8,name,proto_00);
    local_50.field_2._M_allocated_capacity = local_b8.field_2._M_allocated_capacity;
    local_50._M_dataplus._M_p = local_b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      return;
    }
  }
  else {
    pp_Var2 = (this->tables_->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets;
    uVar3 = (this->tables_->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_bucket_count;
    __s1 = (name->_M_dataplus)._M_p;
    cVar10 = *__s1;
    if (cVar10 == '\0') {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      pcVar14 = __s1;
      do {
        pcVar14 = pcVar14 + 1;
        uVar7 = (long)cVar10 + uVar7 * 5;
        cVar10 = *pcVar14;
      } while (cVar10 != '\0');
    }
    for (p_Var16 = pp_Var2[uVar7 % uVar3]; p_Var16 != (_Node *)0x0; p_Var16 = p_Var16->_M_next) {
      iVar5 = strcmp(__s1,(p_Var16->_M_v).first);
      if (iVar5 == 0) {
        p_Var11 = pp_Var2[uVar3];
        goto LAB_001d2e01;
      }
    }
    p_Var11 = pp_Var2[uVar3];
    p_Var16 = p_Var11;
LAB_001d2e01:
    pSVar15 = &(p_Var16->_M_v).second;
    if (p_Var16 == p_Var11) {
      pSVar15 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
    }
    TVar1 = pSVar15->type;
    if (TVar1 == PACKAGE) {
      return;
    }
    std::operator+(&local_50,"\"",name);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_80 = *plVar12;
      lStack_78 = plVar8[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar12;
      local_90 = (long *)*plVar8;
    }
    local_88 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    pFVar9 = anon_unknown_1::Symbol::GetFile((Symbol *)(ulong)TVar1);
    plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_90,**(ulong **)pFVar9);
    plVar12 = plVar8 + 2;
    if ((long *)*plVar8 == plVar12) {
      local_60 = *plVar12;
      lStack_58 = plVar8[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar12;
      local_70 = (long *)*plVar8;
    }
    local_68 = plVar8[1];
    *plVar8 = (long)plVar12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar13 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_b8.field_2._M_allocated_capacity = *psVar13;
      local_b8.field_2._8_8_ = plVar8[3];
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar13;
      local_b8._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_b8._M_string_length = plVar8[1];
    *plVar8 = (long)psVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    AddError(this,name,local_98,NAME,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return;
    }
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void DescriptorBuilder::AddPackage(
    const string& name, const Message& proto, const FileDescriptor* file) {
  if (tables_->AddSymbol(name, Symbol(file))) {
    // Success.  Also add parent package, if any.
    string::size_type dot_pos = name.find_last_of('.');
    if (dot_pos == string::npos) {
      // No parents.
      ValidateSymbolName(name, name, proto);
    } else {
      // Has parent.
      string* parent_name = tables_->AllocateString(name.substr(0, dot_pos));
      AddPackage(*parent_name, proto, file);
      ValidateSymbolName(name.substr(dot_pos + 1), name, proto);
    }
  } else {
    Symbol existing_symbol = tables_->FindSymbol(name);
    // It's OK to redefine a package.
    if (existing_symbol.type != Symbol::PACKAGE) {
      // Symbol seems to have been defined in a different file.
      AddError(name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + name + "\" is already defined (as something other than "
               "a package) in file \"" + existing_symbol.GetFile()->name() +
               "\".");
    }
  }
}